

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType::~IfcDistributionFlowElementType
          (IfcDistributionFlowElementType *this,void **vtt)

{
  void **vtt_local;
  IfcDistributionFlowElementType *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType,_0UL> *)
             &(this->super_IfcDistributionElementType).super_IfcElementType.field_0x190,vtt + 0x28);
  IfcDistributionElementType::~IfcDistributionElementType
            (&this->super_IfcDistributionElementType,vtt + 1);
  return;
}

Assistant:

IfcDistributionFlowElementType() : Object("IfcDistributionFlowElementType") {}